

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_dyn.c
# Opt level: O0

void dynamic_data_ctx_free_func
               (void *parent,void *ptr,CRYPTO_EX_DATA *ad,int idx,long argl,void *argp)

{
  OPENSSL_STACK *st;
  undefined8 *in_RSI;
  dynamic_data_ctx *ctx;
  OPENSSL_sk_freefunc in_stack_ffffffffffffffb8;
  
  if (in_RSI != (undefined8 *)0x0) {
    DSO_free((DSO *)*in_RSI);
    CRYPTO_free((void *)in_RSI[3]);
    CRYPTO_free((void *)in_RSI[5]);
    st = ossl_check_OPENSSL_STRING_sk_type((stack_st_OPENSSL_STRING *)in_RSI[10]);
    ossl_check_OPENSSL_STRING_freefunc_type(int_free_str);
    OPENSSL_sk_pop_free(st,in_stack_ffffffffffffffb8);
    CRYPTO_free(in_RSI);
  }
  return;
}

Assistant:

static void dynamic_data_ctx_free_func(void *parent, void *ptr,
                                       CRYPTO_EX_DATA *ad, int idx, long argl,
                                       void *argp)
{
    if (ptr) {
        dynamic_data_ctx *ctx = (dynamic_data_ctx *)ptr;
        DSO_free(ctx->dynamic_dso);
        OPENSSL_free(ctx->DYNAMIC_LIBNAME);
        OPENSSL_free(ctx->engine_id);
        sk_OPENSSL_STRING_pop_free(ctx->dirs, int_free_str);
        OPENSSL_free(ctx);
    }
}